

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

string * httplib::detail::serialize_multipart_formdata_item_begin<httplib::MultipartFormData>
                   (string *__return_storage_ptr__,MultipartFormData *item,string *boundary)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&bStack_58,"--",boundary);
  std::operator+(__return_storage_ptr__,&bStack_58,"\r\n");
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&local_38,"Content-Disposition: form-data; name=\"",&item->name);
  std::operator+(&bStack_58,&local_38,"\"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,&bStack_58);
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  if ((item->filename)._M_string_length != 0) {
    std::operator+(&local_38,"; filename=\"",&item->filename);
    std::operator+(&bStack_58,&local_38,"\"");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\r\n");
  if ((item->content_type)._M_string_length != 0) {
    std::operator+(&local_38,"Content-Type: ",&item->content_type);
    std::operator+(&bStack_58,&local_38,"\r\n");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,&bStack_58);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (__return_storage_ptr__,"\r\n");
  return __return_storage_ptr__;
}

Assistant:

inline std::string
serialize_multipart_formdata_item_begin(const T &item,
                                        const std::string &boundary) {
  std::string body = "--" + boundary + "\r\n";
  body += "Content-Disposition: form-data; name=\"" + item.name + "\"";
  if (!item.filename.empty()) {
    body += "; filename=\"" + item.filename + "\"";
  }
  body += "\r\n";
  if (!item.content_type.empty()) {
    body += "Content-Type: " + item.content_type + "\r\n";
  }
  body += "\r\n";

  return body;
}